

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::UpdateConversionPathTable(cmake *this)

{
  cmState *this_00;
  char *m2;
  string a;
  string b;
  ifstream table;
  byte abStack_200 [488];
  
  this_00 = this->State;
  std::__cxx11::string::string((string *)&table,"CMAKE_PATH_TRANSLATION_FILE",(allocator *)&a);
  m2 = cmState::GetInitializedCacheValue(this_00,(string *)&table);
  std::__cxx11::string::~string((string *)&table);
  if (m2 != (char *)0x0) {
    std::ifstream::ifstream(&table,m2,_S_in);
    if ((abStack_200[*(long *)(_table + -0x18)] & 5) == 0) {
      a._M_dataplus._M_p = (pointer)&a.field_2;
      a._M_string_length = 0;
      a.field_2._M_local_buf[0] = '\0';
      b._M_dataplus._M_p = (pointer)&b.field_2;
      b._M_string_length = 0;
      b.field_2._M_local_buf[0] = '\0';
      while ((abStack_200[*(long *)(_table + -0x18)] & 2) == 0) {
        std::operator>>((istream *)&table,(string *)&a);
        std::operator>>((istream *)&table,(string *)&b);
        cmsys::SystemTools::AddTranslationPath(&a,&b);
      }
      std::__cxx11::string::~string((string *)&b);
      std::__cxx11::string::~string((string *)&a);
    }
    else {
      cmSystemTools::Error
                ("CMAKE_PATH_TRANSLATION_FILE set to ",m2,". CMake can not open file.",(char *)0x0);
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
    }
    std::ifstream::~ifstream(&table);
  }
  return;
}

Assistant:

void cmake::UpdateConversionPathTable()
{
  // Update the path conversion table with any specified file:
  const char* tablepath =
    this->State
        ->GetInitializedCacheValue("CMAKE_PATH_TRANSLATION_FILE");

  if(tablepath)
    {
    cmsys::ifstream table( tablepath );
    if(!table)
      {
      cmSystemTools::Error("CMAKE_PATH_TRANSLATION_FILE set to ", tablepath,
        ". CMake can not open file.");
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
      }
    else
      {
      std::string a, b;
      while(!table.eof())
        {
        // two entries per line
        table >> a; table >> b;
        cmSystemTools::AddTranslationPath( a, b);
        }
      }
    }
}